

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

uLong cm_zlib_deflateBound(z_streamp_conflict strm,uLong sourceLen)

{
  internal_state_conflict1 *piVar1;
  uLong uVar2;
  
  if ((((strm != (z_streamp_conflict)0x0) &&
       (piVar1 = strm->state, piVar1 != (internal_state_conflict1 *)0x0)) && (piVar1->w_bits == 0xf)
      ) && (piVar1->hash_bits == 0xf)) {
    uVar2 = cm_zlib_compressBound(sourceLen);
    return uVar2;
  }
  return (sourceLen + 7 >> 3) + sourceLen + (sourceLen + 0x3f >> 6) + 0xb;
}

Assistant:

uLong ZEXPORT deflateBound(strm, sourceLen)
    z_streamp strm;
    uLong sourceLen;
{
    deflate_state *s;
    uLong destLen;

    /* conservative upper bound */
    destLen = sourceLen +
              ((sourceLen + 7) >> 3) + ((sourceLen + 63) >> 6) + 11;

    /* if can't get parameters, return conservative bound */
    if (strm == Z_NULL || strm->state == Z_NULL)
        return destLen;

    /* if not default parameters, return conservative bound */
    s = strm->state;
    if (s->w_bits != 15 || s->hash_bits != 8 + 7)
        return destLen;

    /* default settings: return tight bound for that case */
    return compressBound(sourceLen);
}